

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void mouse_button_callback(GLFWwindow *window,wchar_t button,wchar_t action,wchar_t mods)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  undefined1 *puVar7;
  double dVar8;
  
  uVar2 = (ulong)(uint)button;
  pvVar4 = glfwGetWindowUserPointer(window);
  uVar3 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar4 + 8);
  dVar8 = glfwGetTime();
  if ((uint)button < 3) {
    puVar7 = &DAT_0011127c + *(int *)(&DAT_0011127c + uVar2 * 4);
  }
  else {
    puVar7 = get_button_name_name;
    sprintf(get_button_name_name,"%i",uVar2);
  }
  pcVar5 = get_mods_name(mods);
  if ((uint)action < 3) {
    pcVar6 = (&PTR_anon_var_dwarf_34f_00117d20)[(uint)action];
  }
  else {
    pcVar6 = "caused unknown action";
  }
  printf("%08x to %i at %0.3f: Mouse button %i (%s) (with%s) was %s\n",dVar8,(ulong)uVar3,
         (ulong)uVar1,uVar2,puVar7,pcVar5,pcVar6);
  return;
}

Assistant:

static void mouse_button_callback(GLFWwindow* window, int button, int action, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Mouse button %i (%s) (with%s) was %s\n",
           counter++, slot->number, glfwGetTime(), button,
           get_button_name(button),
           get_mods_name(mods),
           get_action_name(action));
}